

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O1

void __thiscall pstack::Exception::Exception(Exception *this,Exception *rhs)

{
  long *local_30 [2];
  long local_20 [2];
  
  *(undefined ***)this = &PTR__Exception_00109d30;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->str,(string *)local_30,_S_out);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  (this->intermediate)._M_dataplus._M_p = (pointer)&(this->intermediate).field_2;
  (this->intermediate)._M_string_length = 0;
  (this->intermediate).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Exception(const Exception &rhs) noexcept : str{ rhs.str.str() } {}